

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *
google::protobuf::internal::MapKeySorter::SortKey
          (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
           *__return_storage_ptr__,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  bool bVar1;
  MapKey *__x;
  iterator iVar2;
  iterator iVar3;
  undefined1 local_d0 [7];
  MapKeyComparator comparator;
  undefined1 local_78 [8];
  MapIterator it;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *sorted_key_list;
  
  it.value_.super_MapValueConstRef._15_1_ = 0;
  std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::vector
            (__return_storage_ptr__);
  Reflection::MapBegin((MapIterator *)local_78,reflection,message,field);
  while( true ) {
    Reflection::MapEnd((MapIterator *)local_d0,reflection,message,field);
    bVar1 = protobuf::operator!=((MapIterator *)local_78,(MapIterator *)local_d0);
    MapIterator::~MapIterator((MapIterator *)local_d0);
    if (!bVar1) break;
    __x = MapIterator::GetKey((MapIterator *)local_78);
    std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::push_back
              (__return_storage_ptr__,__x);
    MapIterator::operator++((MapIterator *)local_78);
  }
  MapIterator::~MapIterator((MapIterator *)local_78);
  iVar2 = std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::begin
                    (__return_storage_ptr__);
  iVar3 = std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::end
                    (__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,google::protobuf::internal::MapKeySorter::MapKeyComparator>
            (iVar2._M_current,iVar3._M_current);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<MapKey> SortKey(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field) {
    std::vector<MapKey> sorted_key_list;
    for (MapIterator it =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         it != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++it) {
      sorted_key_list.push_back(it.GetKey());
    }
    MapKeyComparator comparator;
    std::sort(sorted_key_list.begin(), sorted_key_list.end(), comparator);
    return sorted_key_list;
  }